

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

CQuad * __thiscall CEditor::GetSelectedQuad(CEditor *this)

{
  int iVar1;
  int iVar2;
  CLayer *pCVar3;
  CQuad *pCVar4;
  long in_RDI;
  CLayerQuads *ql;
  CEditor *in_stack_ffffffffffffffe8;
  
  pCVar3 = GetSelectedLayerType(in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (((pCVar3 != (CLayer *)0x0) && (-1 < *(int *)(in_RDI + 0x10dc))) &&
     (iVar1 = *(int *)(in_RDI + 0x10dc),
     iVar2 = array<CQuad,_allocator_default<CQuad>_>::size
                       ((array<CQuad,_allocator_default<CQuad>_> *)&pCVar3[1].m_pEditor),
     iVar1 < iVar2)) {
    pCVar4 = array<CQuad,_allocator_default<CQuad>_>::operator[]
                       ((array<CQuad,_allocator_default<CQuad>_> *)&pCVar3[1].m_pEditor,
                        *(int *)(in_RDI + 0x10dc));
    return pCVar4;
  }
  return (CQuad *)0x0;
}

Assistant:

CQuad *CEditor::GetSelectedQuad()
{
	CLayerQuads *ql = (CLayerQuads *)GetSelectedLayerType(0, LAYERTYPE_QUADS);
	if(!ql)
		return 0;
	if(m_SelectedQuad >= 0 && m_SelectedQuad < ql->m_lQuads.size())
		return &ql->m_lQuads[m_SelectedQuad];
	return 0;
}